

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ylib_deviation(lyd_node *parent,lys_module *cur_mod,ly_bool bis)

{
  lys_module *plVar1;
  LY_ERR LVar2;
  lysp_revision *local_68;
  lys_module *local_50;
  LY_ERR ret___1;
  LY_ERR ret__;
  lys_module *mod;
  uint64_t i;
  ly_bool bis_local;
  lys_module *cur_mod_local;
  lyd_node *parent_local;
  
  if (cur_mod->implemented != '\0') {
    mod = (lys_module *)0x0;
    while( true ) {
      if (cur_mod->deviated_by == (lys_module **)0x0) {
        local_50 = (lys_module *)0x0;
      }
      else {
        local_50 = cur_mod->deviated_by[-1];
      }
      if (local_50 <= mod) break;
      plVar1 = cur_mod->deviated_by[(long)mod];
      if (bis == '\0') {
        if (plVar1->parsed->revs == (lysp_revision *)0x0) {
          local_68 = (lysp_revision *)0x254298;
        }
        else {
          local_68 = plVar1->parsed->revs;
        }
        LVar2 = lyd_new_list(parent,(lys_module *)0x0,"deviation",0,(lyd_node **)0x0,plVar1->name,
                             local_68);
      }
      else {
        LVar2 = lyd_new_term(parent,(lys_module *)0x0,"deviation",plVar1->name,0,(lyd_node **)0x0);
      }
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      mod = (lys_module *)((long)&mod->ctx + 1);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ylib_deviation(struct lyd_node *parent, const struct lys_module *cur_mod, ly_bool bis)
{
    LY_ARRAY_COUNT_TYPE i;
    struct lys_module *mod;

    if (!cur_mod->implemented) {
        /* no deviations of the module for certain */
        return LY_SUCCESS;
    }

    LY_ARRAY_FOR(cur_mod->deviated_by, i) {
        mod = cur_mod->deviated_by[i];

        if (bis) {
            LY_CHECK_RET(lyd_new_term(parent, NULL, "deviation", mod->name, 0, NULL));
        } else {
            LY_CHECK_RET(lyd_new_list(parent, NULL, "deviation", 0, NULL, mod->name,
                    (mod->parsed->revs ? mod->parsed->revs[0].date : "")));
        }
    }

    return LY_SUCCESS;
}